

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffinttyp(char *cval,int *dtype,int *negative,int *status)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  ulong uVar4;
  uint uVar5;
  
  if (0 < *status) {
    return *status;
  }
  *dtype = 0;
  *negative = 0;
  if (*cval == '-') {
    cval = cval + 1;
    *negative = 1;
  }
  else if (*cval == '+') {
    cval = cval + 1;
  }
  if (*cval == '0') {
    for (; *cval == '0'; cval = cval + 1) {
    }
    if (*cval != '\0') goto LAB_0018776e;
  }
  else {
LAB_0018776e:
    sVar2 = strlen(cval);
    uVar5 = (uint)sVar2;
    if (0 < (int)uVar5) {
      ppuVar3 = __ctype_b_loc();
      uVar4 = 0;
      do {
        if ((*(byte *)((long)*ppuVar3 + (long)cval[uVar4] * 2 + 1) & 8) == 0) {
          *status = 0x193;
          return 0x193;
        }
        uVar4 = uVar4 + 1;
      } while ((uVar5 & 0x7fffffff) != uVar4);
    }
    if (uVar5 == 0) {
      *status = 0xcc;
      goto LAB_0018780d;
    }
    if (2 < (int)uVar5) {
      if (uVar5 == 4) goto LAB_001877d4;
      if (uVar5 - 6 < 4) goto LAB_001877e6;
      if (uVar5 - 0xb < 8) goto LAB_001877f8;
      if (0x14 < (int)uVar5) {
LAB_00187807:
        *status = 0x193;
        goto LAB_0018780d;
      }
      if (*negative == 0) {
        if (9 < (int)uVar5) {
          if (uVar5 == 10) {
            iVar1 = strcmp(cval,"2147483647");
            if (iVar1 < 1) goto LAB_001877e6;
            iVar1 = strcmp(cval,"4294967295");
            if (iVar1 < 1) {
              *dtype = 0x1e;
              goto LAB_0018780d;
            }
LAB_001877f8:
            *dtype = 0x51;
          }
          else {
            if (uVar5 == 0x13) {
              iVar1 = strcmp(cval,"9223372036854775807");
              if (iVar1 < 1) goto LAB_001877f8;
            }
            else {
              if (uVar5 != 0x14) goto LAB_0018780d;
              iVar1 = strcmp(cval,"18446744073709551615");
              if (0 < iVar1) goto LAB_00187807;
            }
            *dtype = 0x50;
          }
          goto LAB_0018780d;
        }
        if (uVar5 == 3) {
          iVar1 = strcmp(cval,"127");
          if (iVar1 < 1) goto LAB_001877b0;
          iVar1 = strcmp(cval,"255");
          if (iVar1 < 1) {
            *dtype = 0xb;
            goto LAB_0018780d;
          }
        }
        else {
          if (uVar5 != 5) goto LAB_0018780d;
          iVar1 = strcmp(cval,"32767");
          if (0 < iVar1) {
            iVar1 = strcmp(cval,"65535");
            if (iVar1 < 1) {
              *dtype = 0x14;
              goto LAB_0018780d;
            }
            goto LAB_001877e6;
          }
        }
      }
      else {
        if (9 < (int)uVar5) {
          if (uVar5 == 10) {
            iVar1 = strcmp(cval,"2147483648");
            if (iVar1 < 1) {
LAB_001877e6:
              *dtype = 0x1f;
              goto LAB_0018780d;
            }
          }
          else {
            if (uVar5 != 0x13) goto LAB_0018780d;
            iVar1 = strcmp(cval,"9223372036854775808");
            if (0 < iVar1) goto LAB_00187807;
          }
          goto LAB_001877f8;
        }
        if (uVar5 == 3) {
          iVar1 = strcmp(cval,"128");
          if (iVar1 < 1) goto LAB_001877b0;
        }
        else {
          if (uVar5 != 5) goto LAB_0018780d;
          iVar1 = strcmp(cval,"32768");
          if (0 < iVar1) goto LAB_001877e6;
        }
      }
LAB_001877d4:
      *dtype = 0x15;
      goto LAB_0018780d;
    }
  }
LAB_001877b0:
  *dtype = 0xc;
LAB_0018780d:
  return *status;
}

Assistant:

int ffinttyp(char *cval,  /* I - formatted string representation of the integer */
           int *dtype, /* O - datatype code: TBYTE, TSHORT, TUSHORT, etc */
           int *negative, /* O - is cval negative? */
           int *status)  /* IO - error status */
/*
  determine implicit datatype of input integer string.
  This assumes that the string conforms to the FITS standard
  for integer keyword value, so may not detect all invalid formats.
*/
{
    int ii, len;
    char *p;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    *dtype = 0;  /* initialize to NULL */
    *negative = 0;
    p = cval;

    if (*p == '+') {
        p++;   /* ignore leading + sign */
    } else if (*p == '-') {
        p++;
	*negative = 1;   /* this is a negative number */
    }

    if (*p == '0') {
        while (*p == '0') p++;  /* skip leading zeros */

        if (*p == 0) {  /* the value is a string of 1 or more zeros */
           *dtype  = TSBYTE;
	   return(*status);
        }
    }

    len = strlen(p);
    for (ii = 0; ii < len; ii++)  {
        if (!isdigit(*(p+ii))) {
	    *status = BAD_INTKEY;
	    return(*status);
	}
    }

    /* check for unambiguous cases, based on length of the string */
    if (len == 0) {
        *status = VALUE_UNDEFINED;
    } else if (len < 3) {
        *dtype = TSBYTE;
    } else if (len == 4) {
	*dtype = TSHORT;
    } else if (len > 5 && len < 10) {
        *dtype = TINT;
    } else if (len > 10 && len < 19) {
        *dtype = TLONGLONG;
    } else if (len > 20) {
	*status = BAD_INTKEY;
    } else {
    
      if (!(*negative)) {  /* positive integers */
	if (len == 3) {
	    if (strcmp(p,"127") <= 0 ) {
	        *dtype = TSBYTE;
	    } else if (strcmp(p,"255") <= 0 ) {
	        *dtype = TBYTE;
	    } else {
	        *dtype = TSHORT;
	    }
	} else if (len == 5) {
 	    if (strcmp(p,"32767") <= 0 ) {
	        *dtype = TSHORT;
 	    } else if (strcmp(p,"65535") <= 0 ) {
	        *dtype = TUSHORT;
	    } else {
	        *dtype = TINT;
	    }
	} else if (len == 10) {
	    if (strcmp(p,"2147483647") <= 0 ) {
	        *dtype = TINT;
	    } else if (strcmp(p,"4294967295") <= 0 ) {
	        *dtype = TUINT;
	    } else {
	        *dtype = TLONGLONG;
	    }
	} else if (len == 19) {
	    if (strcmp(p,"9223372036854775807") <= 0 ) {
	        *dtype = TLONGLONG;
	    } else {
		*dtype = TULONGLONG;
	    }
	} else if (len == 20) {
	    if (strcmp(p,"18446744073709551615") <= 0 ) {
	        *dtype = TULONGLONG;
	    } else {
	        *status = BAD_INTKEY;
	    }
	}

      } else {  /* negative integers */
	if (len == 3) {
	    if (strcmp(p,"128") <= 0 ) {
	        *dtype = TSBYTE;
	    } else {
	        *dtype = TSHORT;
	    }
	} else if (len == 5) {
 	    if (strcmp(p,"32768") <= 0 ) {
	        *dtype = TSHORT;
	    } else {
	        *dtype = TINT;
	    }
	} else if (len == 10) {
	    if (strcmp(p,"2147483648") <= 0 ) {
	        *dtype = TINT;
	    } else {
	        *dtype = TLONGLONG;
	    }
	} else if (len == 19) {
	    if (strcmp(p,"9223372036854775808") <= 0 ) {
	        *dtype = TLONGLONG;
	    } else {
		*status = BAD_INTKEY;
	    }
	}
      }
    }

    return(*status);
}